

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall
soul::heart::Printer::PrinterStream::buildLocalVariableList(PrinterStream *this,Function *f)

{
  long *plVar1;
  size_t sVar2;
  pool_ref<soul::heart::Variable> *ppVar3;
  value_type *__x;
  bool bVar4;
  key_type *pkVar5;
  uint uVar6;
  uint uVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  undefined8 *puVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  pointer ppVar12;
  uint uVar13;
  long lVar14;
  uint __uval;
  uint uVar15;
  uint uVar16;
  string name;
  string __str_2;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usedNames;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  localVars;
  value_type local_130;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  uint local_ec;
  long *local_e8 [2];
  long local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  key_type *local_a8;
  PrinterStream *local_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  local_58;
  key_type *local_40;
  _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  local_38 = (_Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->localVariableNames;
  local_a0 = this;
  std::
  _Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear((_Hashtable<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_38);
  Function::getAllLocalVariables(&local_58,f);
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_78,
            (long)local_58.
                  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_58.
                  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  sVar2 = (f->parameters).numActive;
  if (sVar2 != 0) {
    ppVar3 = (f->parameters).items;
    lVar14 = 0;
    do {
      __x = *(value_type **)(*(long *)((long)&ppVar3->object + lVar14) + 0x30);
      if (__x == (value_type *)0x0) {
        throwInternalCompilerError("isValid()","toString",0x23);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_78,__x);
      lVar14 = lVar14 + 8;
    } while (sVar2 << 3 != lVar14);
  }
  local_40 = local_58.
             super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = 0;
    ppVar12 = local_58.
              super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (1 < ppVar12->object->role - mutableLocal) {
        throwInternalCompilerError
                  ("v->isMutableLocal() || v->isConstant()","buildLocalVariableList",0x156);
      }
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
      local_a8 = ppVar12;
      if ((ppVar12->object->name).name == (string *)0x0) {
        local_ec = -uVar7;
        if (0 < (int)uVar7) {
          local_ec = uVar7;
        }
        uVar16 = 1;
        if (9 < local_ec) {
          uVar11 = (ulong)local_ec;
          uVar13 = 4;
          do {
            uVar16 = uVar13;
            uVar15 = (uint)uVar11;
            if (uVar15 < 100) {
              uVar16 = uVar16 - 2;
              goto LAB_00242ddc;
            }
            if (uVar15 < 1000) {
              uVar16 = uVar16 - 1;
              goto LAB_00242ddc;
            }
            if (uVar15 < 10000) goto LAB_00242ddc;
            uVar11 = uVar11 / 10000;
            uVar13 = uVar16 + 4;
          } while (99999 < uVar15);
          uVar16 = uVar16 + 1;
        }
LAB_00242ddc:
        local_110 = &local_100;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_110,(char)-((int)uVar7 >> 0x1f) + (char)uVar16);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uint)-((int)uVar7 >> 0x1f) + (long)local_110),uVar16,local_ec);
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_110);
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        uVar7 = uVar7 + 1;
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_130);
        if (local_130._M_string_length == 0) {
          throwInternalCompilerError("! name.empty()","buildLocalVariableList",0x15c);
        }
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e8,local_130._M_dataplus._M_p,
                   local_130._M_dataplus._M_p + local_130._M_string_length);
        uVar16 = 1;
        while ((_Var8 = std::
                        __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                  (local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   local_78.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,local_e8),
               _Var8._M_current !=
               local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ||
               (_Var8 = std::
                        __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                  ((local_a0->allVisibleVariables).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (local_a0->allVisibleVariables).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,local_e8),
               _Var8._M_current !=
               (local_a0->allVisibleVariables).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish))) {
          local_98 = local_88;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_98,local_130._M_dataplus._M_p,
                     local_130._M_dataplus._M_p + local_130._M_string_length);
          std::__cxx11::string::append((char *)&local_98);
          uVar15 = uVar16 + 1;
          uVar13 = 1;
          if (8 < uVar16) {
            uVar16 = uVar15;
            uVar6 = 4;
            do {
              uVar13 = uVar6;
              if (uVar16 < 100) {
                uVar13 = uVar13 - 2;
                goto LAB_00242bff;
              }
              if (uVar16 < 1000) {
                uVar13 = uVar13 - 1;
                goto LAB_00242bff;
              }
              if (uVar16 < 10000) goto LAB_00242bff;
              bVar4 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              uVar6 = uVar13 + 4;
            } while (bVar4);
            uVar13 = uVar13 + 1;
          }
LAB_00242bff:
          local_c8 = local_b8;
          std::__cxx11::string::_M_construct((ulong)&local_c8,(char)uVar13);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_c8,uVar13,uVar15);
          uVar11 = 0xf;
          if (local_98 != local_88) {
            uVar11 = local_88[0];
          }
          if (uVar11 < (ulong)(local_c0 + local_90)) {
            uVar11 = 0xf;
            if (local_c8 != local_b8) {
              uVar11 = local_b8[0];
            }
            if (uVar11 < (ulong)(local_c0 + local_90)) goto LAB_00242c74;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_98);
          }
          else {
LAB_00242c74:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_c8);
          }
          plVar1 = puVar9 + 2;
          if ((long *)*puVar9 == plVar1) {
            local_100 = *plVar1;
            uStack_f8 = puVar9[3];
            local_110 = &local_100;
          }
          else {
            local_100 = *plVar1;
            local_110 = (long *)*puVar9;
          }
          local_108 = puVar9[1];
          *puVar9 = plVar1;
          puVar9[1] = 0;
          *(undefined1 *)plVar1 = 0;
          std::__cxx11::string::operator=((string *)local_e8,(string *)&local_110);
          if (local_110 != &local_100) {
            operator_delete(local_110,local_100 + 1);
          }
          if (local_c8 != local_b8) {
            operator_delete(local_c8,local_b8[0] + 1);
          }
          uVar16 = uVar15;
          if (local_98 != local_88) {
            operator_delete(local_98,local_88[0] + 1);
          }
        }
        std::__cxx11::string::operator=((string *)&local_130,(string *)local_e8);
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_78,&local_130);
      }
      pkVar5 = local_a8;
      pmVar10 = std::__detail::
                _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[](local_38,local_a8);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,
                        CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                 local_130.field_2._M_local_buf[0]) + 1);
      }
      ppVar12 = pkVar5 + 1;
    } while (ppVar12 != local_40);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if (local_58.
      super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (key_type *)0x0) {
    operator_delete(local_58.
                    super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void buildLocalVariableList (const heart::Function& f)
        {
            int unnamedVariableIndex = 0;
            localVariableNames.clear();
            auto localVars = f.getAllLocalVariables();
            std::vector<std::string> usedNames;
            usedNames.reserve (localVars.size());

            for (auto& v : f.parameters)
                usedNames.push_back (v->name.toString());

            for (auto& v : localVars)
            {
                SOUL_ASSERT (v->isMutableLocal() || v->isConstant());
                std::string name;

                if (v->name.isValid())
                {
                    name = v->name.toString();
                    SOUL_ASSERT (! name.empty());
                    name = addSuffixToMakeUnique (name, [&] (const std::string& nm) { return contains (usedNames, nm)
                                                                                              || contains (allVisibleVariables, nm); });
                    usedNames.push_back (name);
                }
                else
                {
                    name = std::to_string (unnamedVariableIndex++);
                }

                localVariableNames[v] = name;
            }
        }